

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smfdur.cpp
# Opt level: O2

void checkOptions(Options *opts,int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,"f|filename=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"display filename after duration",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"m|minute|minutes=b",&local_59);
  std::__cxx11::string::string
            ((string *)&local_38,"also display duration in minutes after seconds display",&local_5a)
  ;
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"author=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"author of program",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"version=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"compilation info",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"example=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"example usages",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"h|help=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"short description",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  smf::Options::process(opts,argc,argv,1,0);
  std::__cxx11::string::string((string *)&local_58,"author",(allocator *)&local_38);
  bVar1 = smf::Options::getBoolean(opts,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    pcVar3 = "craig@ccrma.stanford.edu, 23 February 2016";
  }
  else {
    std::__cxx11::string::string((string *)&local_58,"version",(allocator *)&local_38);
    bVar1 = smf::Options::getBoolean(opts,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_58,"help",(allocator *)&local_38);
      bVar1 = smf::Options::getBoolean(opts,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (bVar1) {
        smf::Options::getCommand_abi_cxx11_(&local_58,opts);
        usage(local_58._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_58);
      }
      else {
        std::__cxx11::string::string((string *)&local_58,"example",(allocator *)&local_38);
        bVar1 = smf::Options::getBoolean(opts,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar1) {
          return;
        }
      }
      goto LAB_00110df6;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,*argv);
    poVar2 = std::operator<<(poVar2,", version: 23 February 2016");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"compiled: ");
    pcVar3 = "Apr 27 2025";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
LAB_00110df6:
  exit(0);
}

Assistant:

void checkOptions(Options& opts, int argc, char* argv[]) {
	opts.define("f|filename=b", "display filename after duration");
	opts.define("m|minute|minutes=b", "also display duration in minutes after seconds display");

   opts.define("author=b",  "author of program");
   opts.define("version=b", "compilation info");
   opts.define("example=b", "example usages");
   opts.define("h|help=b",  "short description");
   opts.process(argc, argv);

   // handle basic options:
   if (opts.getBoolean("author")) {
      cout << "Written by Craig Stuart Sapp, "
           << "craig@ccrma.stanford.edu, 23 February 2016" << endl;
      exit(0);
   } else if (opts.getBoolean("version")) {
      cout << argv[0] << ", version: 23 February 2016" << endl;
      cout << "compiled: " << __DATE__ << endl;
      exit(0);
   } else if (opts.getBoolean("help")) {
      usage(opts.getCommand().c_str());
      exit(0);
   } else if (opts.getBoolean("example")) {
      example();
      exit(0);
   }

}